

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

void cereal::
     load<cereal::BinaryInputArchive,std::variant<eos::morphablemodel::PcaModel,std::vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>>
               (BinaryInputArchive *ar,
               optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
               *optional)

{
  optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
  *this;
  type args;
  variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>
  *value;
  type args_00;
  bool local_19;
  optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
  *poStack_18;
  bool nullopt;
  optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
  *optional_local;
  BinaryInputArchive *ar_local;
  
  poStack_18 = optional;
  optional_local =
       (optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
        *)ar;
  args = make_nvp<cereal::BinaryInputArchive,bool&>("nullopt",&local_19);
  InputArchive<cereal::BinaryInputArchive,1u>::operator()
            ((InputArchive<cereal::BinaryInputArchive,1u> *)ar,args);
  if ((local_19 & 1U) == 0) {
    std::
    optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
    ::emplace<>(poStack_18);
    this = optional_local;
    value = std::
            optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
            ::operator*(poStack_18);
    args_00 = make_nvp<cereal::BinaryInputArchive,std::variant<eos::morphablemodel::PcaModel,std::vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>&>
                        ("data",value);
    InputArchive<cereal::BinaryInputArchive,1u>::operator()
              ((InputArchive<cereal::BinaryInputArchive,1u> *)this,args_00);
  }
  else {
    std::
    optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
    ::operator=(poStack_18);
  }
  return;
}

Assistant:

inline
  void CEREAL_LOAD_FUNCTION_NAME(Archive& ar, std::optional<T>& optional)
  {
    bool nullopt;
    ar(CEREAL_NVP_("nullopt", nullopt));

    if (nullopt) {
      optional = std::nullopt;
    } else {
      optional.emplace();
      ar(CEREAL_NVP_("data", *optional));
    }
  }